

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::PathTypeHandlerBase::SetSuccessor
          (PathTypeHandlerBase *this,DynamicType *type,PathTypeSuccessorKey successorKey,
          RecyclerWeakReference<Js::DynamicType> *typeWeakRef,ScriptContext *scriptContext)

{
  Type pcVar1;
  PathTypeSuccessorInfo *this_00;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  PathTypeHandlerBase *pPVar5;
  undefined4 *puVar6;
  PathTypeSingleSuccessorInfo *ptr;
  
  pcVar1 = (typeWeakRef->super_RecyclerWeakReferenceBase).strongRef;
  if (pcVar1 != (Type)0x0) {
    iVar4 = (**(code **)(**(long **)(pcVar1 + 0x28) + 0x270))();
    if (iVar4 != 0) {
      pPVar5 = FromTypeHandler(*(DynamicTypeHandler **)(pcVar1 + 0x28));
      if ((pPVar5->predecessorType).ptr != type) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0x12a,
                                    "(!successorType || !successorType->GetTypeHandler()->IsPathTypeHandler() || PathTypeHandlerBase::FromTypeHandler(successorType->GetTypeHandler())->GetPredecessorType() == type)"
                                    ,"We\'re using a successor that has a different predecessor?");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
  }
  this_00 = (this->successorInfo).ptr;
  if (this_00 != (PathTypeSuccessorInfo *)0x0) {
    PathTypeSuccessorInfo::SetSuccessor(this_00,type,successorKey,typeWeakRef,scriptContext);
    return;
  }
  ptr = PathTypeSingleSuccessorInfo::New(successorKey,typeWeakRef,scriptContext);
  Memory::WriteBarrierPtr<Js::PathTypeSuccessorInfo>::WriteBarrierSet
            (&this->successorInfo,&ptr->super_PathTypeSuccessorInfo);
  return;
}

Assistant:

void PathTypeHandlerBase::SetSuccessor(DynamicType * type, const PathTypeSuccessorKey successorKey, RecyclerWeakReference<DynamicType> * typeWeakRef, ScriptContext * scriptContext)
    {
#if DBG
        DynamicType * successorType = typeWeakRef->Get();
        AssertMsg(!successorType || !successorType->GetTypeHandler()->IsPathTypeHandler() ||
                  PathTypeHandlerBase::FromTypeHandler(successorType->GetTypeHandler())->GetPredecessorType() == type, "We're using a successor that has a different predecessor?");
#endif
        if (this->successorInfo == nullptr)
        {
            this->successorInfo = PathTypeSingleSuccessorInfo::New(successorKey, typeWeakRef, scriptContext);
            return;
        }
        this->successorInfo->SetSuccessor(type, successorKey, typeWeakRef, scriptContext);
    }